

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

shared_ptr<wallet::CWallet>
wallet::RestoreWallet
          (WalletContext *context,path *backup_file,string *wallet_name,optional<bool> load_on_start
          ,DatabaseStatus *status,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  undefined4 *in_R9;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar4;
  DatabaseOptions *in_stack_00000008;
  shared_ptr<wallet::CWallet> *in_stack_00000010;
  exception *e;
  shared_ptr<wallet::CWallet> wallet;
  path wallet_file;
  path wallet_path;
  DatabaseOptions options;
  DatabaseOptions *in_stack_fffffffffffffc28;
  bilingual_str *in_stack_fffffffffffffc30;
  bilingual_str *in_stack_fffffffffffffc38;
  path *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  undefined6 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5e;
  string *in_stack_fffffffffffffc60;
  string *original;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  element_type *name;
  WalletContext *context_00;
  DatabaseOptions *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  _Optional_payload_base<bool> load_on_start_00;
  string local_311 [2];
  bilingual_str *in_stack_fffffffffffffd40;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_fffffffffffffd48;
  path local_78;
  undefined1 local_50;
  pointer local_8;
  
  load_on_start_00 = SUB82((ulong)in_RSI >> 0x30,0);
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  context_00 = (WalletContext *)&stack0xffffffffffffffb0;
  name = in_RDI;
  DatabaseOptions::DatabaseOptions(in_stack_fffffffffffffc28);
  ReadDatabaseArgs((ArgsManager *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                   in_stack_fffffffffffffc88);
  local_50 = 1;
  GetWalletDir();
  fs::u8path(in_stack_fffffffffffffc60);
  fsbridge::AbsPathJoin
            ((path *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (path *)in_stack_fffffffffffffc60);
  fs::path::~path((path *)in_stack_fffffffffffffc28);
  fs::path::~path((path *)in_stack_fffffffffffffc28);
  fs::path::path((path *)in_stack_fffffffffffffc28,(path *)0xad4e60);
  fs::operator/(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
  fs::path::~path((path *)in_stack_fffffffffffffc28);
  std::shared_ptr<wallet::CWallet>::shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc28);
  uVar1 = fs::exists((path *)in_stack_fffffffffffffc28);
  if ((bool)uVar1) {
    uVar2 = fs::exists((path *)in_stack_fffffffffffffc28);
    if (((bool)uVar2) ||
       (in_stack_fffffffffffffc5e = TryCreateDirectories((path *)in_stack_fffffffffffffc50),
       !(bool)in_stack_fffffffffffffc5e)) {
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffc30);
      tinyformat::format<std::__cxx11::string>
                ((char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58
                                                )),in_stack_fffffffffffffc50);
      Untranslated(in_stack_fffffffffffffc60);
      bilingual_str::operator=(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffc28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc28);
      *in_R9 = 4;
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc28,(nullptr_t)0xad5133);
    }
    else {
      fs::copy_file((path *)in_stack_fffffffffffffc38,(path *)in_stack_fffffffffffffc30,
                    (copy_options)((ulong)in_stack_fffffffffffffc28 >> 0x30));
      LoadWallet(context_00,(string *)name,(optional<bool>)load_on_start_00,
                 (DatabaseOptions *)in_RDI,
                 (DatabaseStatus *)CONCAT17(uVar1,in_stack_fffffffffffffc68),
                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
      std::shared_ptr<wallet::CWallet>::operator=
                ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc38,in_stack_00000010);
      _GLOBAL__N_1::std::shared_ptr<wallet::CWallet>::~shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_00000008);
      bVar3 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                         in_stack_00000008);
      in_stack_fffffffffffffc28 = in_stack_00000008;
      if (!bVar3) {
        std::filesystem::remove_all(&local_78);
        in_stack_fffffffffffffc28 = in_stack_00000008;
      }
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc28,
                 (shared_ptr<wallet::CWallet> *)0xad5542);
    }
  }
  else {
    original = local_311;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
               (char *)in_RDI,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffc68));
    Untranslated(original);
    bilingual_str::operator=(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffc28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    std::allocator<char>::~allocator((allocator<char> *)local_311);
    *in_R9 = 10;
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc28,(nullptr_t)0xad4f54);
  }
  _GLOBAL__N_1::std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc28);
  fs::path::~path((path *)in_stack_fffffffffffffc28);
  fs::path::~path((path *)in_stack_fffffffffffffc28);
  DatabaseOptions::~DatabaseOptions(in_stack_fffffffffffffc28);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = name;
  return (shared_ptr<wallet::CWallet>)
         sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CWallet> RestoreWallet(WalletContext& context, const fs::path& backup_file, const std::string& wallet_name, std::optional<bool> load_on_start, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    DatabaseOptions options;
    ReadDatabaseArgs(*context.args, options);
    options.require_existing = true;

    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::u8path(wallet_name));
    auto wallet_file = wallet_path / "wallet.dat";
    std::shared_ptr<CWallet> wallet;

    try {
        if (!fs::exists(backup_file)) {
            error = Untranslated("Backup file does not exist");
            status = DatabaseStatus::FAILED_INVALID_BACKUP_FILE;
            return nullptr;
        }

        if (fs::exists(wallet_path) || !TryCreateDirectories(wallet_path)) {
            error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(wallet_path)));
            status = DatabaseStatus::FAILED_ALREADY_EXISTS;
            return nullptr;
        }

        fs::copy_file(backup_file, wallet_file, fs::copy_options::none);

        wallet = LoadWallet(context, wallet_name, load_on_start, options, status, error, warnings);
    } catch (const std::exception& e) {
        assert(!wallet);
        if (!error.empty()) error += Untranslated("\n");
        error += strprintf(Untranslated("Unexpected exception: %s"), e.what());
    }
    if (!wallet) {
        fs::remove_all(wallet_path);
    }

    return wallet;
}